

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O0

void Amap_ManMergeNodeCuts(Amap_Man_t *p,Amap_Obj_t *pNode)

{
  uint uVar1;
  uint uVar2;
  Amap_Cut_t AVar3;
  uint uVar4;
  int iVar5;
  Amap_Obj_t *pAVar6;
  Amap_Obj_t *pAVar7;
  int local_78;
  int local_70;
  int **local_68;
  int iFan1;
  int iFan0;
  int iCompl1;
  int iCompl0;
  int c;
  int k;
  int i;
  int Entry;
  int **pRules;
  Amap_Cut_t *pCut1;
  Amap_Cut_t *pCut0;
  Amap_Obj_t *pFanin1;
  Amap_Obj_t *pFanin0;
  Amap_Obj_t *pNode_local;
  Amap_Man_t *p_local;
  
  pAVar6 = Amap_ObjFanin0(p,pNode);
  pAVar7 = Amap_ObjFanin1(p,pNode);
  if ((pNode->field_11).pData != (void *)0x0) {
    __assert_fail("pNode->pData == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapMerge.c"
                  ,0x1c1,"void Amap_ManMergeNodeCuts(Amap_Man_t *, Amap_Obj_t *)");
  }
  if (((uint)*(undefined8 *)pNode & 7) == 6) {
    Amap_ManMergeNodeCutsMux(p,pNode);
  }
  else {
    if (((uint)*(undefined8 *)pNode & 7) == 6) {
      __assert_fail("pNode->Type != AMAP_OBJ_MUX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapMerge.c"
                    ,0x1c7,"void Amap_ManMergeNodeCuts(Amap_Man_t *, Amap_Obj_t *)");
    }
    if (((uint)*(undefined8 *)pNode & 7) == 4) {
      local_68 = p->pLib->pRules;
    }
    else {
      local_68 = p->pLib->pRulesX;
    }
    iCompl1 = 0;
    pCut1 = (Amap_Cut_t *)(pAVar6->field_11).pData;
    while (iCompl1 < (int)pAVar6->nCuts) {
      AVar3 = *pCut1;
      uVar2 = Amap_ObjFaninC0(pNode);
      uVar2 = (uint)AVar3 >> 0x10 & 1 ^ uVar2;
      if (((uint)*pCut1 & 0xffff) == 0) {
        local_70 = 0;
      }
      else {
        local_70 = Abc_Var2Lit((uint)*pCut1 & 0xffff,uVar2);
      }
      if (((uint)*pCut1 >> 0x11 == 1) && (uVar2 != 0)) {
        AVar3 = (Amap_Cut_t)Abc_LitNot((int)pCut1[1]);
        pCut1[1] = AVar3;
      }
      for (c = 0; uVar1 = local_68[local_70][c], uVar1 != 0; c = c + 1) {
        p->pMatsTemp[(int)(uVar1 & 0xffff)] = (int)uVar1 >> 0x10;
      }
      iCompl0 = 0;
      pRules = (int **)(pAVar7->field_11).pData;
      while (iCompl0 < (int)pAVar7->nCuts) {
        uVar1 = *(uint *)pRules;
        uVar4 = Amap_ObjFaninC1(pNode);
        uVar4 = uVar1 >> 0x10 & 1 ^ uVar4;
        if (((ulong)*pRules & 0xffff) == 0) {
          local_78 = 0;
        }
        else {
          local_78 = Abc_Var2Lit(*(uint *)pRules & 0xffff,uVar4);
        }
        if (p->pMatsTemp[local_78] != 0) {
          if ((*(uint *)pRules >> 0x11 == 1) && (uVar4 != 0)) {
            iVar5 = Abc_LitNot(*(int *)((long)pRules + 4));
            *(int *)((long)pRules + 4) = iVar5;
          }
          if (local_70 < local_78) {
            Amap_ManCutCreate(p,(Amap_Cut_t *)pRules,pCut1,p->pMatsTemp[local_78]);
          }
          else {
            Amap_ManCutCreate(p,pCut1,(Amap_Cut_t *)pRules,p->pMatsTemp[local_78]);
          }
          if ((*(uint *)pRules >> 0x11 == 1) && (uVar4 != 0)) {
            iVar5 = Abc_LitNot(*(int *)((long)pRules + 4));
            *(int *)((long)pRules + 4) = iVar5;
          }
        }
        iCompl0 = iCompl0 + 1;
        pRules = (int **)Amap_ManCutNext((Amap_Cut_t *)pRules);
      }
      if (((uint)*pCut1 >> 0x11 == 1) && (uVar2 != 0)) {
        AVar3 = (Amap_Cut_t)Abc_LitNot((int)pCut1[1]);
        pCut1[1] = AVar3;
      }
      for (c = 0; local_68[local_70][c] != 0; c = c + 1) {
        p->pMatsTemp[(int)(local_68[local_70][c] & 0xffff)] = 0;
      }
      iCompl1 = iCompl1 + 1;
      pCut1 = Amap_ManCutNext(pCut1);
    }
    Amap_ManCutSaveStored(p,pNode);
    p->nCutsUsed = pNode->nCuts + p->nCutsUsed;
    p->nCutsTried = pAVar6->nCuts * pAVar7->nCuts + p->nCutsTried;
    if ((*(ulong *)pNode >> 0x3e & 1) != 0) {
      Amap_ManMergeNodeChoice(p,pNode);
    }
  }
  return;
}

Assistant:

void Amap_ManMergeNodeCuts( Amap_Man_t * p, Amap_Obj_t * pNode )
{
    Amap_Obj_t * pFanin0 = Amap_ObjFanin0( p, pNode );
    Amap_Obj_t * pFanin1 = Amap_ObjFanin1( p, pNode );
    Amap_Cut_t * pCut0, * pCut1;
    int ** pRules, Entry, i, k, c, iCompl0, iCompl1, iFan0, iFan1;
    assert( pNode->pData == NULL );
    if ( pNode->Type == AMAP_OBJ_MUX )
    {
        Amap_ManMergeNodeCutsMux( p, pNode );
        return;
    }
    assert( pNode->Type != AMAP_OBJ_MUX );
    pRules = (pNode->Type == AMAP_OBJ_AND)? p->pLib->pRules: p->pLib->pRulesX;
    Amap_NodeForEachCut( pFanin0, pCut0, c )
    {
        iCompl0 = pCut0->fInv ^ Amap_ObjFaninC0(pNode);
        iFan0   = !pCut0->iMat? 0: Abc_Var2Lit( pCut0->iMat, iCompl0 );
        // complement literals
        if ( pCut0->nFans == 1 && iCompl0 )
            pCut0->Fans[0] = Abc_LitNot(pCut0->Fans[0]);
        // label resulting sets
        for ( i = 0; (Entry = pRules[iFan0][i]); i++ )
            p->pMatsTemp[Entry & 0xffff] = (Entry >> 16);
        // iterate through the cuts
        Amap_NodeForEachCut( pFanin1, pCut1, k )
        {
            iCompl1 = pCut1->fInv ^ Amap_ObjFaninC1(pNode);
            iFan1   = !pCut1->iMat? 0: Abc_Var2Lit( pCut1->iMat, iCompl1 );
            if ( p->pMatsTemp[iFan1] == 0 )
                continue;
            // complement literals
            if ( pCut1->nFans == 1 && iCompl1 )
                pCut1->Fans[0] = Abc_LitNot(pCut1->Fans[0]);
            // create new cut
            if ( iFan0 >= iFan1 )
                Amap_ManCutCreate( p, pCut0, pCut1, p->pMatsTemp[iFan1] );
            else
                Amap_ManCutCreate( p, pCut1, pCut0, p->pMatsTemp[iFan1] );
            // uncomplement literals
            if ( pCut1->nFans == 1 && iCompl1 )
                pCut1->Fans[0] = Abc_LitNot(pCut1->Fans[0]);
        }
        // uncomplement literals
        if ( pCut0->nFans == 1 && iCompl0 )
            pCut0->Fans[0] = Abc_LitNot(pCut0->Fans[0]);
        // label resulting sets
        for ( i = 0; (Entry = pRules[iFan0][i]); i++ )
            p->pMatsTemp[Entry & 0xffff] = 0;
    }
    Amap_ManCutSaveStored( p, pNode );
    p->nCutsUsed += pNode->nCuts;
    p->nCutsTried += pFanin0->nCuts * pFanin1->nCuts;
//    assert( (int)pNode->nCuts == Amap_ManMergeCountCuts(p, pNode) );
    if ( pNode->fRepr )
        Amap_ManMergeNodeChoice( p, pNode );

//    Amap_ManPrintCuts( pNode );
}